

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

void __thiscall
slang::TypedBumpAllocator<slang::ast::Scope::WildcardImportData>::~TypedBumpAllocator
          (TypedBumpAllocator<slang::ast::Scope::WildcardImportData> *this)

{
  Segment *pSVar1;
  Segment *p;
  Segment *pSVar2;
  
  for (pSVar1 = (this->super_BumpAllocator).head; pSVar1 != (Segment *)0x0; pSVar1 = pSVar1->prev) {
    for (pSVar2 = pSVar1 + 1; pSVar2 != (Segment *)pSVar1->current; pSVar2 = pSVar2 + 5) {
      if (pSVar2[3].prev != (Segment *)0x0) {
        operator_delete(pSVar2[3].prev,
                        (((long)pSVar2[2].prev * 0x178 + 0x186U) / 3 & 0xfffffffffffffff8) * 3);
      }
      p = pSVar2->prev;
      if (p != (Segment *)0x0) {
        operator_delete(p,(long)pSVar2[1].prev - (long)p);
      }
    }
  }
  BumpAllocator::~BumpAllocator(&this->super_BumpAllocator);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }